

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3.cpp
# Opt level: O3

int __thiscall arbiter::drivers::S3::copy(S3 *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  Config *pCVar2;
  _Alloc_hider _Var3;
  int extraout_EAX;
  long *plVar4;
  undefined8 *puVar5;
  mapped_type *this_00;
  ulong *puVar6;
  ulong uVar7;
  Headers headers;
  Resource resource;
  undefined8 *local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  ulong *local_220;
  long local_218;
  ulong local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  key_type local_1c0;
  undefined1 *local_1a0;
  ulong local_198;
  undefined1 local_190 [16];
  string local_180;
  string local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  Resource local_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  void *local_48 [3];
  
  local_140._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140._M_impl.super__Rb_tree_header._M_header;
  local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar2 = (this->m_config)._M_t.
           super___uniq_ptr_impl<arbiter::drivers::S3::Config,_std::default_delete<arbiter::drivers::S3::Config>_>
           ._M_t.
           super__Tuple_impl<0UL,_arbiter::drivers::S3::Config_*,_std::default_delete<arbiter::drivers::S3::Config>_>
           .super__Head_base<0UL,_arbiter::drivers::S3::Config_*,_false>._M_head_impl;
  _Var3._M_p = (pCVar2->m_baseUrl)._M_dataplus._M_p;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_140._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,_Var3._M_p,_Var3._M_p + (pCVar2->m_baseUrl)._M_string_length);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,*(long *)dst,*(long *)(dst + 8) + *(long *)dst);
  Resource::Resource(&local_110,&local_160,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  local_1a0 = local_190;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_110.m_bucket._M_dataplus._M_p,
             local_110.m_bucket._M_dataplus._M_p + local_110.m_bucket._M_string_length);
  plVar4 = (long *)::std::__cxx11::string::_M_replace_aux((ulong)&local_1a0,local_198,0,'\x01');
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_210 = *puVar6;
    uStack_208 = (undefined4)plVar4[3];
    uStack_204 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_220 = &local_210;
  }
  else {
    local_210 = *puVar6;
    local_220 = (ulong *)*plVar4;
  }
  local_218 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_200 = local_1f0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_110.m_object._M_dataplus._M_p,
             local_110.m_object._M_dataplus._M_p + local_110.m_object._M_string_length);
  uVar7 = 0xf;
  if (local_220 != &local_210) {
    uVar7 = local_210;
  }
  if (uVar7 < (ulong)(local_1f8 + local_218)) {
    uVar7 = 0xf;
    if (local_200 != local_1f0) {
      uVar7 = local_1f0[0];
    }
    if ((ulong)(local_1f8 + local_218) <= uVar7) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_220);
      goto LAB_0015e1d5;
    }
  }
  puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_200);
LAB_0015e1d5:
  local_248 = &local_238;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_238 = *puVar1;
    uStack_230 = *(undefined4 *)(puVar5 + 3);
    uStack_22c = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_238 = *puVar1;
    local_248 = (undefined8 *)*puVar5;
  }
  uStack_240 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"x-amz-copy-source","");
  this_00 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_140,&local_1c0);
  ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  local_1e0[0] = local_1d0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,*(long *)src,*(long *)(src + 8) + *(long *)src);
  local_248 = (undefined8 *)0x0;
  uStack_240 = 0;
  local_238 = 0;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_78,&local_140);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  (*(this->super_Http).super_Driver._vptr_Driver[9])
            (local_48,this,local_1e0,&local_248,&local_78,&local_a8);
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0]);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_78);
  if (local_248 != (undefined8 *)0x0) {
    operator_delete(local_248);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_object._M_dataplus._M_p != &local_110.m_object.field_2) {
    operator_delete(local_110.m_object._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_bucket._M_dataplus._M_p != &local_110.m_bucket.field_2) {
    operator_delete(local_110.m_bucket._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_baseUrl._M_dataplus._M_p != &local_110.m_baseUrl.field_2) {
    operator_delete(local_110.m_baseUrl._M_dataplus._M_p);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_140);
  return extraout_EAX;
}

Assistant:

void S3::copy(const std::string src, const std::string dst) const
{
    Headers headers;
    const Resource resource(m_config->baseUrl(), src);
    headers["x-amz-copy-source"] = resource.bucket() + '/' + resource.object();
    put(dst, std::vector<char>(), headers, Query());
}